

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall ieee754::is_mantissa_zero(ieee754 *this)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  
  uVar2 = this->ebits;
  if ((int)uVar2 < 8) {
    puVar1 = this->buf;
    pbVar6 = puVar1 + (long)this->bytes + -1;
    uVar3 = this->bytes - 1;
    uVar5 = 0x7f;
  }
  else {
    uVar5 = 0;
    if (0xf < uVar2) goto LAB_002680f1;
    puVar1 = this->buf;
    pbVar6 = puVar1 + (long)this->bytes + -2;
    uVar3 = this->bytes - 2;
    uVar2 = (uint)(byte)((char)uVar2 - 7);
    uVar5 = 0xff;
  }
  uVar5 = (uint)*pbVar6 & uVar5 >> ((byte)uVar2 & 0x1f);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      pbVar6 = puVar1 + uVar4;
      uVar4 = uVar4 + 1;
      uVar5 = uVar5 + *pbVar6;
    } while (uVar3 != uVar4);
  }
LAB_002680f1:
  return (int)(uVar5 == 0);
}

Assistant:

int mantissa_msb_index() const
    {
        if (ebits <= 7)
            return bytes - 1;
        else if (ebits <= 15)
            return bytes - 2;
        else
        {
            assert(FALSE);
            return 0;
        }
    }